

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

result<std::pair<long,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
toml::detail::parse_integer<std::vector<char,std::allocator<char>>>
          (result<std::pair<long,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,detail *this,
          location<std::vector<char,_std::allocator<char>_>_> *loc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  source_ptr *psVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  char cVar5;
  const_iterator f;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  undefined8 uVar7;
  undefined8 uVar8;
  size_type sVar9;
  int iVar10;
  value_type *pvVar11;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var12;
  const_iterator in_RCX;
  location<std::vector<char,_std::allocator<char>_>_> *extraout_RDX;
  region<std::vector<char,_std::allocator<char>_>_> *this_00;
  initializer_list<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  initializer_list<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_01;
  string str;
  result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
  token;
  integer retval;
  istringstream iss;
  allocator_type local_2d9;
  undefined1 local_2d8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2b8;
  undefined **local_2b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288 [2];
  undefined1 local_268 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_248;
  undefined1 local_240 [16];
  const_iterator cStack_230;
  const_iterator cStack_228;
  char *pcStack_220;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_218;
  location<std::vector<char,_std::allocator<char>_>_> *local_1f8;
  undefined1 local_1f0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1d0;
  size_type local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  char *local_1b0;
  char *pcStack_1a8;
  undefined1 local_1a0 [8];
  region<std::vector<char,_std::allocator<char>_>_> local_198;
  ios_base local_128 [264];
  
  f._M_current = *(char **)(this + 0x40);
  if ((f._M_current == *(char **)(*(long *)(this + 8) + 8)) || (*f._M_current != '0')) {
LAB_00124c97:
    sequence<toml::detail::maybe<toml::detail::either<toml::detail::character<(char)43>,toml::detail::character<(char)45>>>,toml::detail::either<toml::detail::sequence<toml::detail::in_range<(char)49,(char)57>,toml::detail::repeat<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::sequence<toml::detail::character<(char)95>,toml::detail::in_range<(char)48,(char)57>>>,toml::detail::at_least<1ul>>>,toml::detail::in_range<(char)48,(char)57>>>
    ::invoke<std::vector<char,std::allocator<char>>>
              ((result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
                *)&local_2b8,
               (sequence<toml::detail::maybe<toml::detail::either<toml::detail::character<(char)43>,toml::detail::character<(char)45>>>,toml::detail::either<toml::detail::sequence<toml::detail::in_range<(char)49,(char)57>,toml::detail::repeat<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::sequence<toml::detail::character<(char)95>,toml::detail::in_range<(char)48,(char)57>>>,toml::detail::at_least<1ul>>>,toml::detail::in_range<(char)48,(char)57>>>
                *)this,loc);
    if (local_2b8._0_1_ == true) {
      pvVar11 = result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
                ::unwrap((result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
                          *)&local_2b8);
      make_string<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
                ((string *)local_2d8,(detail *)(pvVar11->first_)._M_current,
                 (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
                 (pvVar11->last_)._M_current,
                 (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
                 in_RCX._M_current);
      local_1a0[0] = 0x5f;
      _Var12 = std::
               __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                         ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           )local_2d8._0_8_,
                          (char *)(local_2d8._0_8_ + (long)(region_base **)local_2d8._8_8_),
                          (_Iter_equals_val<const_char>)local_1a0);
      local_2d8._8_8_ = _Var12._M_current + -local_2d8._0_8_;
      *_Var12._M_current = '\0';
      std::__cxx11::istringstream::istringstream
                ((istringstream *)local_1a0,(string *)local_2d8,_S_in);
      local_218.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      std::istream::_M_extract<long>((long *)local_1a0);
      pvVar11 = result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
                ::unwrap((result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
                          *)&local_2b8);
      local_1f0._0_8_ =
           local_218.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      region<std::vector<char,_std::allocator<char>_>_>::region
                ((region<std::vector<char,_std::allocator<char>_>_> *)(local_1f0 + 8),pvVar11);
      sVar9 = local_1c8;
      uVar8 = local_1e0._8_8_;
      uVar7 = local_1e0._M_allocated_capacity;
      paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_240 + 8);
      local_268._0_8_ = local_1f0._0_8_;
      local_268._8_8_ = &PTR__region_00160ab8;
      local_1e0._M_allocated_capacity = 0;
      local_1e0._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (local_1d0 == &local_1c0) {
        cStack_230._M_current = (char *)local_1c0._8_8_;
        local_248 = paVar4;
      }
      else {
        local_248 = local_1d0;
      }
      local_240._9_7_ = local_1c0._M_allocated_capacity._1_7_;
      local_240[8] = local_1c0._M_local_buf[0];
      local_1c8 = 0;
      local_1c0._M_local_buf[0] = '\0';
      cStack_228._M_current = local_1b0;
      pcStack_220 = pcStack_1a8;
      __return_storage_ptr__->is_ok_ = true;
      (__return_storage_ptr__->field_1).succ.value.first = local_1f0._0_8_;
      (__return_storage_ptr__->field_1).succ.value.second.super_region_base._vptr_region_base =
           (_func_int **)&PTR__region_00160ab8;
      (__return_storage_ptr__->field_1).succ.value.second.source_.
      super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)uVar7;
      (__return_storage_ptr__->field_1).succ.value.second.source_.
      super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      aStack_258._8_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      (__return_storage_ptr__->field_1).succ.value.second.source_.
      super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8;
      aStack_258._M_allocated_capacity = 0;
      paVar3 = &(__return_storage_ptr__->field_1).succ.value.second.source_name_.field_2;
      (__return_storage_ptr__->field_1).succ.value.second.source_name_._M_dataplus._M_p =
           (pointer)paVar3;
      if (local_248 == paVar4) {
        paVar3->_M_allocated_capacity = local_240._8_8_;
        *(char **)((long)&(__return_storage_ptr__->field_1).succ.value.second.source_name_.field_2 +
                  8) = cStack_230._M_current;
      }
      else {
        (__return_storage_ptr__->field_1).succ.value.second.source_name_._M_dataplus._M_p =
             (pointer)local_248;
        (__return_storage_ptr__->field_1).succ.value.second.source_name_.field_2.
        _M_allocated_capacity = local_240._8_8_;
      }
      (__return_storage_ptr__->field_1).succ.value.second.source_name_._M_string_length = sVar9;
      local_240._0_8_ = 0;
      local_240._8_8_ = (ulong)(uint7)local_1c0._M_allocated_capacity._1_7_ << 8;
      (__return_storage_ptr__->field_1).succ.value.second.first_._M_current = local_1b0;
      (__return_storage_ptr__->field_1).succ.value.second.last_._M_current = pcStack_1a8;
      local_248 = paVar4;
      local_1d0 = &local_1c0;
      region<std::vector<char,_std::allocator<char>_>_>::~region
                ((region<std::vector<char,_std::allocator<char>_>_> *)(local_268 + 8));
      region<std::vector<char,_std::allocator<char>_>_>::~region
                ((region<std::vector<char,_std::allocator<char>_>_> *)(local_1f0 + 8));
      std::__cxx11::istringstream::~istringstream((istringstream *)local_1a0);
      std::ios_base::~ios_base(local_128);
      if ((pointer)local_2d8._0_8_ != (pointer)(local_2d8 + 0x10)) {
        operator_delete((void *)local_2d8._0_8_,(ulong)(local_2d8._16_8_ + 1));
      }
      if (local_2b8._0_1_ != true) {
        return __return_storage_ptr__;
      }
      this_00 = (region<std::vector<char,_std::allocator<char>_>_> *)&local_2b0;
LAB_00125082:
      region<std::vector<char,_std::allocator<char>_>_>::~region(this_00);
      return __return_storage_ptr__;
    }
    location<std::vector<char,_std::allocator<char>_>_>::reset
              ((location<std::vector<char,_std::allocator<char>_>_> *)this,f);
    local_1f0._0_8_ = &local_1e0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1f0,"[error] toml::parse_integer: ","");
    p_Var6 = &local_198.source_.
              super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount;
    local_1a0 = (undefined1  [8])this;
    local_198.super_region_base._vptr_region_base = (_func_int **)p_Var6;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(local_1a0 + 8),"the next token is not an integer","");
    __l_01._M_len = 1;
    __l_01._M_array = (iterator)local_1a0;
    std::
    vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_2d8,__l_01,(allocator_type *)&local_1f8);
    local_218.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_218.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_218.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    format_underline((string *)local_268,(string *)local_1f0,
                     (vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_2d8,&local_218);
    local_2a8[0]._M_allocated_capacity = aStack_258._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._0_8_ == &aStack_258) {
      local_2a8[0]._8_8_ = aStack_258._8_8_;
      local_2b8 = local_2a8;
    }
    else {
      local_2b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_268._0_8_;
    }
    aStack_258._M_allocated_capacity = aStack_258._M_allocated_capacity & 0xffffffffffffff00;
    __return_storage_ptr__->is_ok_ = false;
    psVar2 = &(__return_storage_ptr__->field_1).succ.value.second.source_;
    (__return_storage_ptr__->field_1).succ.value.first = (long)psVar2;
    if (local_2b8 == local_2a8) {
      (psVar2->
      super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      )._M_ptr = (element_type *)local_2a8[0]._0_8_;
      (__return_storage_ptr__->field_1).succ.value.second.source_.
      super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8[0]._8_8_;
    }
    else {
      (__return_storage_ptr__->field_1).succ.value.first = (long)local_2b8;
      (__return_storage_ptr__->field_1).succ.value.second.source_.
      super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)local_2a8[0]._0_8_;
    }
    (__return_storage_ptr__->field_1).succ.value.second.super_region_base._vptr_region_base =
         (_func_int **)local_268._8_8_;
    local_2a8[0]._M_allocated_capacity = local_2a8[0]._M_allocated_capacity & 0xffffffffffffff00;
    local_268._8_8_ = (element_type *)0x0;
    local_2b0 = (_func_int **)0x0;
    local_2b8 = local_2a8;
    local_268._0_8_ = &aStack_258;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_218);
    std::
    vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_2d8);
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_198.super_region_base._vptr_region_base
        == p_Var6) goto LAB_00124f53;
  }
  else {
    in_RCX._M_current = f._M_current + 1;
    if (in_RCX._M_current == *(char **)(*(long *)(this + 8) + 8)) {
      region<std::vector<char,_std::allocator<char>_>_>::region
                ((region<std::vector<char,_std::allocator<char>_>_> *)local_268,
                 (location<std::vector<char,_std::allocator<char>_>_> *)this,
                 (const_iterator)f._M_current,in_RCX);
      local_198.source_name_.field_2._M_allocated_capacity = local_240._0_8_;
      paVar4 = local_248;
      uVar8 = aStack_258._M_allocated_capacity;
      uVar7 = local_268._8_8_;
      local_2b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((ulong)local_2b8 & 0xffffffff00000000);
      local_2b0 = &PTR__region_00160ab8;
      local_268._8_8_ = (element_type *)0x0;
      aStack_258._M_allocated_capacity = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)aStack_258._8_8_ ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240) {
        local_288[0]._8_8_ = local_240._8_8_;
        local_2a8[1]._0_8_ = local_288;
      }
      else {
        local_2a8[1]._0_8_ = aStack_258._8_8_;
      }
      local_248 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
      local_240._0_8_ = local_240._0_8_ & 0xffffffffffffff00;
      local_288[1]._0_8_ = cStack_230._M_current;
      local_288[1]._8_8_ = cStack_228._M_current;
      paVar3 = &local_198.source_name_.field_2;
      local_1a0 = (undefined1  [8])((ulong)local_1a0 & 0xffffffff00000000);
      local_198.super_region_base._vptr_region_base = (_func_int **)&PTR__region_00160ab8;
      local_2a8[0]._M_allocated_capacity = (element_type *)0x0;
      local_2a8[0]._8_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8[1]._0_8_ == local_288) {
        local_198.source_name_.field_2._8_8_ = local_288[0]._8_8_;
        local_198.source_name_._M_dataplus._M_p = (pointer)paVar3;
      }
      else {
        local_198.source_name_._M_dataplus._M_p = (pointer)local_2a8[1]._0_8_;
      }
      local_2a8[1]._8_8_ = 0;
      local_288[0]._M_allocated_capacity =
           local_198.source_name_.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_198.first_._M_current = cStack_230._M_current;
      local_198.last_._M_current = cStack_228._M_current;
      __return_storage_ptr__->is_ok_ = true;
      (__return_storage_ptr__->field_1).succ.value.first = 0;
      (__return_storage_ptr__->field_1).succ.value.second.super_region_base._vptr_region_base =
           (_func_int **)&PTR__region_00160ab8;
      (__return_storage_ptr__->field_1).succ.value.second.source_.
      super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)uVar7;
      (__return_storage_ptr__->field_1).succ.value.second.source_.
      super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_198.source_.
      super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (__return_storage_ptr__->field_1).succ.value.second.source_.
      super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8;
      local_198.source_.
      super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      paVar1 = &(__return_storage_ptr__->field_1).succ.value.second.source_name_.field_2;
      (__return_storage_ptr__->field_1).succ.value.second.source_name_._M_dataplus._M_p =
           (pointer)paVar1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198.source_name_._M_dataplus._M_p == paVar3) {
        paVar1->_M_allocated_capacity = local_198.source_name_.field_2._M_allocated_capacity;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->field_1).succ.value.second.source_name_.field_2 + 8) =
             local_198.source_name_.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->field_1).succ.value.second.source_name_._M_dataplus._M_p =
             local_198.source_name_._M_dataplus._M_p;
        (__return_storage_ptr__->field_1).succ.value.second.source_name_.field_2.
        _M_allocated_capacity = local_198.source_name_.field_2._M_allocated_capacity;
      }
      (__return_storage_ptr__->field_1).succ.value.second.source_name_._M_string_length =
           (size_type)paVar4;
      local_198.source_name_._M_string_length = 0;
      local_198.source_name_.field_2._M_allocated_capacity =
           local_198.source_name_.field_2._M_allocated_capacity & 0xffffffffffffff00;
      (__return_storage_ptr__->field_1).succ.value.second.first_._M_current = cStack_230._M_current;
      (__return_storage_ptr__->field_1).succ.value.second.last_._M_current = cStack_228._M_current;
      local_2a8[1]._0_8_ = local_288;
      aStack_258._8_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_240;
      local_198.source_name_._M_dataplus._M_p = (pointer)paVar3;
      region<std::vector<char,_std::allocator<char>_>_>::~region
                ((region<std::vector<char,_std::allocator<char>_>_> *)(local_1a0 + 8));
      region<std::vector<char,_std::allocator<char>_>_>::~region
                ((region<std::vector<char,_std::allocator<char>_>_> *)&local_2b0);
      this_00 = (region<std::vector<char,_std::allocator<char>_>_> *)local_268;
      goto LAB_00125082;
    }
    cVar5 = *in_RCX._M_current;
    if (cVar5 == 'x') {
      parse_hexadecimal_integer<std::vector<char,std::allocator<char>>>
                (__return_storage_ptr__,this,loc);
      return __return_storage_ptr__;
    }
    if (cVar5 == 'o') {
      parse_octal_integer<std::vector<char,std::allocator<char>>>(__return_storage_ptr__,this,loc);
      return __return_storage_ptr__;
    }
    if (cVar5 == 'b') {
      parse_binary_integer<std::vector<char,std::allocator<char>>>(__return_storage_ptr__,this,loc);
      return __return_storage_ptr__;
    }
    if ((int)cVar5 - 0x30U < 10) {
      local_1f0._0_8_ = &local_1e0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1f0,
                 "[error] toml::parse_integer: leading zero in an Integer is not allowed.","");
      local_1f8 = (location<std::vector<char,_std::allocator<char>_>_> *)this;
      std::
      pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<toml::detail::location<std::vector<char,_std::allocator<char>_>_>_*,_const_char_(&)[13],_true>
                ((pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_1a0,&local_1f8,(char (*) [13])0x14a5ac);
      __l._M_len = 1;
      __l._M_array = (iterator)local_1a0;
      std::
      vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_2d8,__l,&local_2d9);
      local_218.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_218.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_218.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      format_underline((string *)local_268,(string *)local_1f0,
                       (vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_2d8,&local_218);
    }
    else {
      iVar10 = isalpha((int)cVar5);
      loc = extraout_RDX;
      if (iVar10 == 0) goto LAB_00124c97;
      local_1f0._0_8_ = &local_1e0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1f0,"[error] toml::parse_integer: unknown integer prefix appeared."
                 ,"");
      local_1f8 = (location<std::vector<char,_std::allocator<char>_>_> *)this;
      std::
      pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<toml::detail::location<std::vector<char,_std::allocator<char>_>_>_*,_const_char_(&)[19],_true>
                ((pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_1a0,&local_1f8,(char (*) [19])"none of 0x, 0o, 0b");
      __l_00._M_len = 1;
      __l_00._M_array = (iterator)local_1a0;
      std::
      vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_2d8,__l_00,&local_2d9);
      local_218.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_218.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_218.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      format_underline((string *)local_268,(string *)local_1f0,
                       (vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_2d8,&local_218);
    }
    local_2a8[0]._M_allocated_capacity = aStack_258._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._0_8_ == &aStack_258) {
      local_2a8[0]._8_8_ = aStack_258._8_8_;
      local_2b8 = local_2a8;
    }
    else {
      local_2b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_268._0_8_;
    }
    aStack_258._M_allocated_capacity = aStack_258._M_allocated_capacity & 0xffffffffffffff00;
    __return_storage_ptr__->is_ok_ = false;
    psVar2 = &(__return_storage_ptr__->field_1).succ.value.second.source_;
    (__return_storage_ptr__->field_1).succ.value.first = (long)psVar2;
    if (local_2b8 == local_2a8) {
      (psVar2->
      super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      )._M_ptr = (element_type *)local_2a8[0]._0_8_;
      (__return_storage_ptr__->field_1).succ.value.second.source_.
      super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8[0]._8_8_;
    }
    else {
      (__return_storage_ptr__->field_1).succ.value.first = (long)local_2b8;
      (__return_storage_ptr__->field_1).succ.value.second.source_.
      super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)local_2a8[0]._0_8_;
    }
    (__return_storage_ptr__->field_1).succ.value.second.super_region_base._vptr_region_base =
         (_func_int **)local_268._8_8_;
    local_2a8[0]._M_allocated_capacity = local_2a8[0]._M_allocated_capacity & 0xffffffffffffff00;
    local_268._8_8_ = (element_type *)0x0;
    local_2b0 = (_func_int **)0x0;
    local_2b8 = local_2a8;
    local_268._0_8_ = &aStack_258;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_218);
    std::
    vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_2d8);
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_198.super_region_base._vptr_region_base
        == &local_198.source_.
            super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount) goto LAB_00124f53;
  }
  operator_delete(local_198.super_region_base._vptr_region_base,
                  (long)local_198.source_.
                        super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi + 1);
LAB_00124f53:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._0_8_ != &local_1e0) {
    operator_delete((void *)local_1f0._0_8_,(ulong)(local_1e0._M_allocated_capacity + 1));
  }
  return __return_storage_ptr__;
}

Assistant:

result<std::pair<integer, region<Container>>, std::string>
parse_integer(location<Container>& loc)
{
    const auto first = loc.iter();
    if(first != loc.end() && *first == '0')
    {
        const auto second = std::next(first);
        if(second == loc.end()) // the token is just zero.
        {
            return ok(std::make_pair(0, region<Container>(loc, first, second)));
        }

        if(*second == 'b') {return parse_binary_integer     (loc);} // 0b1100
        if(*second == 'o') {return parse_octal_integer      (loc);} // 0o775
        if(*second == 'x') {return parse_hexadecimal_integer(loc);} // 0xC0FFEE

        if(std::isdigit(*second))
        {
            return err(format_underline("[error] toml::parse_integer: "
                "leading zero in an Integer is not allowed.",
                {{std::addressof(loc), "leading zero"}}));
        }
        else if(std::isalpha(*second))
        {
             return err(format_underline("[error] toml::parse_integer: "
                "unknown integer prefix appeared.",
                {{std::addressof(loc), "none of 0x, 0o, 0b"}}));
        }
    }

    if(const auto token = lex_dec_int::invoke(loc))
    {
        auto str = token.unwrap().str();
        str.erase(std::remove(str.begin(), str.end(), '_'), str.end());

        std::istringstream iss(str);
        integer retval(0);
        iss >> retval;
        return ok(std::make_pair(retval, token.unwrap()));
    }
    loc.reset(first);
    return err(format_underline("[error] toml::parse_integer: ",
               {{std::addressof(loc), "the next token is not an integer"}}));
}